

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Block::~Block(Block *this)

{
  intrusive_list<wabt::Expr>::clear(&this->exprs);
  FuncDeclaration::~FuncDeclaration(&this->decl);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit Block(ExprList exprs) : exprs(std::move(exprs)) {}